

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall
GraphBuilder::GraphBuilder(GraphBuilder *this,DGLLVMPointerAnalysis *pointsToAnalysis)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  std::unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>::
  unordered_set((unordered_set<Node_*,_std::hash<Node_*>,_std::equal_to<Node_*>,_std::allocator<Node_*>_>
                 *)0x192468);
  std::
  unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
  ::unordered_map((unordered_map<const_llvm::Instruction_*,_Node_*,_std::hash<const_llvm::Instruction_*>,_std::equal_to<const_llvm::Instruction_*>,_std::allocator<std::pair<const_llvm::Instruction_*const,_Node_*>_>_>
                   *)0x192475);
  std::
  unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
  ::unordered_map((unordered_map<const_llvm::BasicBlock_*,_BlockGraph_*,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_BlockGraph_*>_>_>
                   *)0x192482);
  std::
  unordered_map<const_llvm::Function_*,_FunctionGraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>_>
  ::unordered_map((unordered_map<const_llvm::Function_*,_FunctionGraph_*,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_FunctionGraph_*>_>_>
                   *)0x192492);
  std::
  unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
  ::unordered_map((unordered_map<const_llvm::CallInst_*,_JoinNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_JoinNode_*>_>_>
                   *)0x1924a2);
  std::
  unordered_map<const_llvm::CallInst_*,_ForkNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_ForkNode_*>_>_>
  ::unordered_map((unordered_map<const_llvm::CallInst_*,_ForkNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_ForkNode_*>_>_>
                   *)0x1924b2);
  std::
  unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
  ::unordered_map((unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
                   *)0x1924c2);
  std::
  unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
  ::unordered_map((unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
                   *)0x1924d2);
  return;
}

Assistant:

GraphBuilder::GraphBuilder(dg::DGLLVMPointerAnalysis *pointsToAnalysis)
        : pointsToAnalysis_(pointsToAnalysis) {}